

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

double __thiscall
duckdb::Interpolator<true>::Operation<double,double,duckdb::QuantileDirect<double>>
          (Interpolator<true> *this,double *v_t,Vector *result,QuantileDirect<double> *accessor)

{
  bool bVar1;
  InvalidInputException *this_00;
  duckdb *this_01;
  RESULT_TYPE_conflict4 input;
  double result_1;
  double local_40;
  string local_38;
  
  input = InterpolateInternal<double,duckdb::QuantileDirect<double>>(this,v_t,accessor);
  this_01 = (duckdb *)0x0;
  bVar1 = TryCast::Operation<double,double>(input,&local_40,false);
  if (bVar1) {
    return local_40;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<double,double>(&local_38,this_01,input);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(InterpolateInternal(v_t, accessor), result);
	}